

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::JapaneseCalendar::handleGetLimit
          (JapaneseCalendar *this,UCalendarDateFields field,ELimitType limitType)

{
  uint in_EAX;
  int32_t iVar1;
  int32_t iVar2;
  UErrorCode status;
  undefined8 uStack_18;
  
  if (field == UCAL_YEAR) {
    iVar2 = 1;
    if (limitType - UCAL_LIMIT_MAXIMUM < 2) {
      uStack_18 = (ulong)in_EAX;
      iVar1 = EraRules::getStartYear
                        (gJapaneseEraRules,gCurrentEra,(UErrorCode *)((long)&uStack_18 + 4));
      iVar2 = GregorianCalendar::handleGetLimit
                        (&this->super_GregorianCalendar,UCAL_YEAR,UCAL_LIMIT_MAXIMUM);
      iVar2 = iVar2 - iVar1;
    }
  }
  else {
    if (field != UCAL_ERA) {
      iVar2 = GregorianCalendar::handleGetLimit(&this->super_GregorianCalendar,field,limitType);
      return iVar2;
    }
    iVar2 = 0;
    if (UCAL_LIMIT_GREATEST_MINIMUM < limitType) {
      iVar2 = gCurrentEra;
    }
  }
  return iVar2;
}

Assistant:

int32_t JapaneseCalendar::handleGetLimit(UCalendarDateFields field, ELimitType limitType) const
{
    switch(field) {
    case UCAL_ERA:
        if (limitType == UCAL_LIMIT_MINIMUM || limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
            return 0;
        }
        return gCurrentEra;
    case UCAL_YEAR:
        {
            switch (limitType) {
            case UCAL_LIMIT_MINIMUM:
            case UCAL_LIMIT_GREATEST_MINIMUM:
                return 1;
            case UCAL_LIMIT_LEAST_MAXIMUM:
                return 1;
            case  UCAL_LIMIT_COUNT: //added to avoid warning
            case UCAL_LIMIT_MAXIMUM:
            {
                UErrorCode status = U_ZERO_ERROR;
                int32_t eraStartYear = gJapaneseEraRules->getStartYear(gCurrentEra, status);
                U_ASSERT(U_SUCCESS(status));
                return GregorianCalendar::handleGetLimit(UCAL_YEAR, UCAL_LIMIT_MAXIMUM) - eraStartYear;
            }
            default:
                return 1;    // Error condition, invalid limitType
            }
        }
    default:
        return GregorianCalendar::handleGetLimit(field,limitType);
    }
}